

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

void __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode::CacheNode
          (CacheNode *this,pair<sjtu::orderType,_long> *value_,locType *offset_,
          LRUCache<std::pair<sjtu::orderType,_long>_> *bel_)

{
  pair<sjtu::orderType,_long> *ppVar1;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  pair<sjtu::orderType,_long> *in_RDI;
  value_type *in_stack_00000010;
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
  *in_stack_00000018;
  pair<sjtu::orderType,_long> *in_stack_ffffffffffffff88;
  pair<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*> local_40;
  pair<const_long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*> local_30;
  undefined8 local_20;
  undefined8 *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::pair<sjtu::orderType,_long>::pair(in_RDI,in_stack_ffffffffffffff88);
  *(undefined8 *)in_RDI[1].first.username = *local_18;
  in_RDI[1].first.username[8] = '\0';
  *(undefined8 *)(in_RDI[1].first.username + 0x10) = 0;
  ppVar1 = in_RDI + 1;
  (ppVar1->first).trainID[3] = '\0';
  (ppVar1->first).trainID[4] = '\0';
  (ppVar1->first).trainID[5] = '\0';
  (ppVar1->first).trainID[6] = '\0';
  (ppVar1->first).trainID[7] = '\0';
  (ppVar1->first).trainID[8] = '\0';
  (ppVar1->first).trainID[9] = '\0';
  (ppVar1->first).trainID[10] = '\0';
  *(undefined8 *)(in_RDI[1].first.trainID + 0xb) = local_20;
  local_40 = std::make_pair<long&,sjtu::LRUCache<std::pair<sjtu::orderType,long>>::CacheNode*>
                       ((long *)in_RDI,(CacheNode **)in_stack_ffffffffffffff88);
  std::pair<const_long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*>::
  pair<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_true>
            (&local_30,&local_40);
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
  insert(in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}